

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindLargest(MergingIterator *this)

{
  Comparator *pCVar1;
  IteratorWrapper *pIVar2;
  IteratorWrapper *this_00;
  int iVar3;
  IteratorWrapper *pIVar4;
  IteratorWrapper *this_01;
  ulong uVar5;
  long in_FS_OFFSET;
  Slice local_58;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (ulong)(uint)this->n_;
  this_00 = (IteratorWrapper *)0x0;
  do {
    this_01 = this_00;
    iVar3 = (int)uVar5 + 1;
    pIVar4 = this->children_ + uVar5;
    do {
      iVar3 = iVar3 + -1;
      if (iVar3 < 1) {
        this->current_ = this_01;
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return;
      }
      this_00 = pIVar4 + -1;
      uVar5 = uVar5 - 1;
      pIVar2 = pIVar4 + -1;
      pIVar4 = this_00;
    } while (pIVar2->valid_ != true);
    if (this_01 != (IteratorWrapper *)0x0) {
      pCVar1 = this->comparator_;
      local_48 = IteratorWrapper::key(this_00);
      local_58 = IteratorWrapper::key(this_01);
      iVar3 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_48,&local_58);
      if (iVar3 < 1) {
        this_00 = this_01;
      }
    }
  } while( true );
}

Assistant:

void MergingIterator::FindLargest() {
  IteratorWrapper* largest = nullptr;
  for (int i = n_ - 1; i >= 0; i--) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (largest == nullptr) {
        largest = child;
      } else if (comparator_->Compare(child->key(), largest->key()) > 0) {
        largest = child;
      }
    }
  }
  current_ = largest;
}